

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::SeparateProgramsTessControl::Run(SeparateProgramsTessControl *this)

{
  uint uVar1;
  long lVar2;
  uint program;
  mapped_type *pmVar3;
  long error;
  GLenum props3 [12];
  allocator<char> local_149;
  GLint expected3 [12];
  GLint expected2 [10];
  GLenum props2 [10];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesO;
  key_type local_58;
  char *srcTCS;
  
  error = 0;
  srcTCS = 
  "#version 430                                                  \nlayout(vertices = 3) out;                                     \nlayout(location = 0) patch out vec4 data;                     \nout gl_PerVertex {                                            \n   vec4 gl_Position;                                          \n   float gl_PointSize;                                        \n   float gl_ClipDistance[];                                   \n} gl_out[];                                                   \nin Color {                                 \n  float r, g, b;                           \n  vec4 iLikePie;                           \n} vs_color[];                              \nvoid main() {                                                                   \n   data = vec4(1);                                                              \n   gl_out[gl_InvocationID].gl_Position =                                        \n           vec4(vs_color[0].r, vs_color[0].g, vs_color[0].b, vs_color[0].iLikePie.x + float(gl_InvocationID));       \n   gl_TessLevelInner[0] = 1.0;                                                  \n   gl_TessLevelInner[1] = 1.0;                                                  \n   gl_TessLevelOuter[0] = 1.0;                                                  \n   gl_TessLevelOuter[1] = 1.0;                                                  \n   gl_TessLevelOuter[2] = 1.0;                                                  \n}"
  ;
  program = (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.
              super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x18])(this,0x8e88,1);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e3,0x92f6,0x10,&error);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e3,0x92f5,5,&error);
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesI._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesO._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props3,"gl_PerVertex.gl_Position",(allocator<char> *)expected3);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e4,&indicesO,props3,&error);
  std::__cxx11::string::~string((string *)props3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props3,"data",(allocator<char> *)expected3);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e4,&indicesO,props3,&error);
  std::__cxx11::string::~string((string *)props3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props3,"Color.r",(allocator<char> *)expected3);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e3,&indicesI,props3,&error);
  std::__cxx11::string::~string((string *)props3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props3,"Color.g",(allocator<char> *)expected3);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e3,&indicesI,props3,&error);
  std::__cxx11::string::~string((string *)props3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props3,"Color.b",(allocator<char> *)expected3);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e3,&indicesI,props3,&error);
  std::__cxx11::string::~string((string *)props3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props3,"Color.iLikePie",(allocator<char> *)expected3);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e3,&indicesI,props3,&error);
  std::__cxx11::string::~string((string *)props3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props3,"gl_PerVertex.gl_Position",(allocator<char> *)props2);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,(key_type *)props3);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)expected3,"gl_PerVertex.gl_Position",(allocator<char> *)expected2);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e4,(ulong)uVar1,expected3,&error)
  ;
  std::__cxx11::string::~string((string *)expected3);
  std::__cxx11::string::~string((string *)props3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props3,"data",(allocator<char> *)props2);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,(key_type *)props3);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)expected3,"data",(allocator<char> *)expected2);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e4,(ulong)uVar1,expected3,&error)
  ;
  std::__cxx11::string::~string((string *)expected3);
  std::__cxx11::string::~string((string *)props3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props3,"Color.r",(allocator<char> *)props2);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props3);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)expected3,"Color.r",(allocator<char> *)expected2);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e3,(ulong)uVar1,expected3,&error)
  ;
  std::__cxx11::string::~string((string *)expected3);
  std::__cxx11::string::~string((string *)props3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props3,"Color.g",(allocator<char> *)props2);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props3);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)expected3,"Color.g",(allocator<char> *)expected2);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e3,(ulong)uVar1,expected3,&error)
  ;
  std::__cxx11::string::~string((string *)expected3);
  std::__cxx11::string::~string((string *)props3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props3,"Color.b",(allocator<char> *)props2);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props3);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)expected3,"Color.b",(allocator<char> *)expected2);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e3,(ulong)uVar1,expected3,&error)
  ;
  std::__cxx11::string::~string((string *)expected3);
  std::__cxx11::string::~string((string *)props3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props3,"Color.iLikePie",(allocator<char> *)props2);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props3);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)expected3,"Color.iLikePie",(allocator<char> *)expected2);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e3,(ulong)uVar1,expected3,&error)
  ;
  std::__cxx11::string::~string((string *)expected3);
  std::__cxx11::string::~string((string *)props3);
  props2[4] = 0x930a;
  props2[5] = 0x9309;
  props2[6] = 0x9307;
  props2[7] = 0x9308;
  props2[0] = 0x92f9;
  props2[1] = 0x92fa;
  props2[2] = 0x92fb;
  props2[3] = 0x930b;
  props2[8] = 0x9306;
  props2[9] = 0x92e7;
  expected2[4] = 0;
  expected2[5] = 0;
  expected2[8] = 0;
  expected2[9] = 0;
  expected2[0] = 0xf;
  expected2[1] = 0x8b52;
  expected2[2] = 1;
  expected2[3] = 0;
  expected2[6] = 1;
  expected2[7] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props3,"Color.iLikePie",(allocator<char> *)expected3);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props3);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e3,(ulong)*pmVar3,10,props2,10,(allocator<char> *)expected2,
             &error);
  std::__cxx11::string::~string((string *)props3);
  props3[8] = 0x9306;
  props3[9] = 0x92e7;
  props3[10] = 0x930e;
  props3[0xb] = 0x930f;
  props3[4] = 0x930a;
  props3[5] = 0x9309;
  props3[6] = 0x9307;
  props3[7] = 0x9308;
  props3[0] = 0x92f9;
  props3[1] = 0x92fa;
  props3[2] = 0x92fb;
  props3[3] = 0x930b;
  expected3[4] = 0;
  expected3[5] = 0;
  expected3[0] = 5;
  expected3[1] = 0x8b52;
  expected3[2] = 1;
  expected3[3] = 0;
  expected3[6] = 1;
  expected3[7] = 0;
  expected3[8] = 0;
  expected3[9] = 1;
  expected3[10] = 0;
  expected3[0xb] = -1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"data",&local_149);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,&local_58);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e4,(ulong)*pmVar3,0xc,props3,0xc,(allocator<char> *)expected3,
             &error);
  std::__cxx11::string::~string((string *)&local_58);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.
              super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,program);
  lVar2 = error;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesO._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesI._M_t);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		long error = NO_ERROR;

		const char* srcTCS = "#version 430                                                  \n"
							 "layout(vertices = 3) out;                                     \n"
							 "layout(location = 0) patch out vec4 data;                     \n"
							 "out gl_PerVertex {                                            \n"
							 "   vec4 gl_Position;                                          \n"
							 "   float gl_PointSize;                                        \n"
							 "   float gl_ClipDistance[];                                   \n"
							 "} gl_out[];                                                   \n"
							 ""
							 "in Color {                                 \n"
							 "  float r, g, b;                           \n"
							 "  vec4 iLikePie;                           \n"
							 "} vs_color[];                              \n"
							 ""
							 "void main() {                                                                   \n"
							 "   data = vec4(1);                                                              \n"
							 "   gl_out[gl_InvocationID].gl_Position =                                        \n"
							 "           vec4(vs_color[0].r, vs_color[0].g, vs_color[0].b, vs_color[0].iLikePie.x + "
							 "float(gl_InvocationID));       \n"
							 "   gl_TessLevelInner[0] = 1.0;                                                  \n"
							 "   gl_TessLevelInner[1] = 1.0;                                                  \n"
							 "   gl_TessLevelOuter[0] = 1.0;                                                  \n"
							 "   gl_TessLevelOuter[1] = 1.0;                                                  \n"
							 "   gl_TessLevelOuter[2] = 1.0;                                                  \n"
							 "}";

		const GLuint tcs = CreateShaderProgram(GL_TESS_CONTROL_SHADER, 1, &srcTCS);

		// gl_InvocationID should be included
		VerifyGetProgramInterfaceiv(tcs, GL_PROGRAM_INPUT, GL_MAX_NAME_LENGTH, 16, error);
		VerifyGetProgramInterfaceiv(tcs, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, 5, error);

		std::map<std::string, GLuint> indicesI;
		std::map<std::string, GLuint> indicesO;
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_OUTPUT, indicesO, "gl_PerVertex.gl_Position", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_OUTPUT, indicesO, "data", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "Color.r", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "Color.g", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "Color.b", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "Color.iLikePie", error);

		VerifyGetProgramResourceName(tcs, GL_PROGRAM_OUTPUT, indicesO["gl_PerVertex.gl_Position"],
									 "gl_PerVertex.gl_Position", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_OUTPUT, indicesO["data"], "data", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["Color.r"], "Color.r", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["Color.g"], "Color.g", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["Color.b"], "Color.b", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["Color.iLikePie"], "Color.iLikePie", error);

		GLenum props2[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_IS_PER_PATCH };
		GLint expected2[] = { 15, GL_FLOAT_VEC4, 1, 0, 0, 0, 1, 0, 0, 0 };
		VerifyGetProgramResourceiv(tcs, GL_PROGRAM_INPUT, indicesI["Color.iLikePie"], 10, props2, 10, expected2, error);

		GLenum props3[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_IS_PER_PATCH,
							GL_LOCATION,
							GL_LOCATION_INDEX };
		GLint expected3[] = { 5, GL_FLOAT_VEC4, 1, 0, 0, 0, 1, 0, 0, 1, 0, -1 };
		VerifyGetProgramResourceiv(tcs, GL_PROGRAM_OUTPUT, indicesO["data"], 12, props3, 12, expected3, error);

		glDeleteProgram(tcs);
		return error;
	}